

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall OPL::DOSBox::DBOPL::Channel::Channel(Channel *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    Operator::Operator((Operator *)((long)&this->op[0].volHandler + lVar1));
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0xd0);
  *(undefined8 *)(this->old + 1) = 0x1f00000000;
  this->maskLeft = -1;
  this->maskRight = -1;
  this->synthHandler = (SynthHandler)BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)1>;
  *(undefined8 *)&this->field_0xd8 = 0;
  this->chanData = 0;
  this->old[0] = 0;
  return;
}

Assistant:

Channel::Channel() {
	old[0] = old[1] = 0;
	chanData = 0;
	regB0 = 0;
	regC0 = 0;
	maskLeft = -1;
	maskRight = -1;
	feedback = 31;
	fourMask = 0;
	synthHandler = &Channel::BlockTemplate< sm2FM >;
}